

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * __thiscall
re2::PrefixSuccessor_abi_cxx11_(string *__return_storage_ptr__,re2 *this,StringPiece *prefix)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  string limit;
  char *local_38;
  ulong local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,*(long *)this,(long)*(int *)(this + 8) + *(long *)this);
  if (0 < (int)local_30) {
    uVar2 = (int)local_30 - 1;
    bVar1 = false;
    do {
      uVar4 = (ulong)uVar2;
      if (local_38[uVar4] == -1) {
        if (local_30 < uVar4) {
          uVar3 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase");
          if (local_38 != &local_28) {
            operator_delete(local_38);
          }
          _Unwind_Resume(uVar3);
        }
        local_38[uVar4] = '\0';
        uVar2 = uVar2 - 1;
        local_30 = uVar4;
      }
      else {
        local_38[uVar4] = local_38[uVar4] + '\x01';
        bVar1 = true;
      }
    } while ((!bVar1) && (-1 < (int)uVar2));
    if (bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_38 == &local_28) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
      }
      __return_storage_ptr__->_M_string_length = local_30;
      local_30 = 0;
      local_28 = '\0';
      local_38 = &local_28;
      goto LAB_0013d671;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0013d671:
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string PrefixSuccessor(const StringPiece& prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  bool done = false;
  string limit(prefix.data(), prefix.size());
  int index = static_cast<int>(limit.size()) - 1;
  while (!done && index >= 0) {
    if ((limit[index]&255) == 255) {
      limit.erase(index);
      index--;
    } else {
      limit[index]++;
      done = true;
    }
  }
  if (!done) {
    return "";
  } else {
    return limit;
  }
}